

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall
mp::SolverOptionSynonym::SolverOptionSynonym
          (SolverOptionSynonym *this,char *names,SolverOption *real)

{
  char **args;
  pointer local_40;
  string local_38;
  
  args = (char **)0x0;
  SolverOption::SolverOption(&this->super_SolverOption,names,"",(ValueArrayRef)ZEXT816(0),false);
  (this->super_SolverOption)._vptr_SolverOption = (_func_int **)&PTR__SolverOptionSynonym_004cc890;
  this->real_ = real;
  (this->desc_)._M_dataplus._M_p = (pointer)&(this->desc_).field_2;
  (this->desc_)._M_string_length = 0;
  (this->desc_).field_2._M_local_buf[0] = '\0';
  local_40 = (real->name_)._M_dataplus._M_p;
  fmt::sprintf<char_const*>(&local_38,(fmt *)"Synonym for %s.",(CStringRef)&local_40,args);
  std::__cxx11::string::operator=((string *)&this->desc_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::assign((char *)&(this->super_SolverOption).description_);
  return;
}

Assistant:

SolverOptionSynonym(const char* names, SolverOption& real) :
    SolverOption(names, ""), real_(&real) {
    desc_ = fmt::sprintf("Synonym for %s.", real_->name());
    set_description( desc_.c_str() );
  }